

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetMotorCurrent(AmpIO *this,uint index,uint32_t sdata)

{
  uint32_t uVar1;
  uint uVar2;
  uint local_24;
  quadlet_t data;
  uint32_t sdata_local;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    local_24 = sdata & 0xffff | 0x80000000;
    if (((this->collect_state & 1U) != 0) && ((uint)this->collect_chan == index + 1)) {
      local_24 = sdata & 0xffff | 0xc0000000;
    }
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      uVar2 = ((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 0x18;
    }
    else {
      uVar2 = this->WriteBuffer[this->WB_CURR_OFFSET + index] & 0x30000000;
    }
    local_24 = uVar2 | local_24;
    this->WriteBuffer[this->WB_CURR_OFFSET + index] = local_24;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::SetMotorCurrent(unsigned int index, uint32_t sdata)
{
    if (index >= NumMotors)
        return false;

    quadlet_t data = VALID_BIT | (sdata & DAC_MASK);
    if (collect_state && (collect_chan == (index+1)))
        data |= COLLECT_BIT;
    if (GetFirmwareVersion() < 8) {
        data |= ((BoardId & 0x0F) << 24);
    }
    else {
        // Preserve any motor enable bits set by SetAmpEnable
        data |= WriteBuffer[WB_CURR_OFFSET+index]&(MOTOR_ENABLE_MASK|MOTOR_ENABLE_BIT);
    }
    WriteBuffer[WB_CURR_OFFSET+index] = data;
    return true;
}